

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<pstore::small_vector<int,2ul>,void>
               (small_vector<int,_2UL> *container,ostream *os)

{
  bool bVar1;
  value_type *value;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  small_vector<int,_2UL> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  small_vector<int,_2UL> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (small_vector<int,_2UL> *)0x0;
  __end0 = pstore::small_vector<int,_2UL>::begin(container);
  elem = (value_type *)pstore::small_vector<int,_2UL>::end(container);
  do {
    bVar1 = pstore::pointer_based_iterator<int_const>::operator!=
                      ((pointer_based_iterator<int_const> *)&__end0,
                       (pointer_based_iterator<const_int> *)&elem);
    if (!bVar1) {
LAB_001765c5:
      if (__range3 != (small_vector<int,_2UL> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = pstore::pointer_based_iterator<const_int>::operator*(&__end0);
    if ((__range3 != (small_vector<int,_2UL> *)0x0) &&
       (std::operator<<(os,','), __range3 == (small_vector<int,_2UL> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_001765c5;
    }
    std::operator<<(os,' ');
    UniversalPrint<int>(value,os);
    __range3 = (small_vector<int,_2UL> *)((long)&__range3->elements_ + 1);
    pstore::pointer_based_iterator<const_int>::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }